

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.h
# Opt level: O0

QSet<QByteArray> __thiscall SymbolStack::excludeSymbols(SymbolStack *this)

{
  bool bVar1;
  const_iterator o;
  Data *in_RDI;
  long in_FS_OFFSET;
  SafeSymbols *sf;
  SymbolStack *__range1;
  QSet<QByteArray> *set;
  const_iterator __end1;
  const_iterator __begin1;
  QSet<QByteArray> *in_stack_ffffffffffffff98;
  Hash this_00;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  this_00.d = in_RDI;
  QSet<QByteArray>::QSet((QSet<QByteArray> *)0x181c9b);
  local_10.i = (SafeSymbols *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<SafeSymbols>::begin((QList<SafeSymbols> *)in_RDI);
  o = QList<SafeSymbols>::end((QList<SafeSymbols> *)in_RDI);
  while (bVar1 = QList<SafeSymbols>::const_iterator::operator!=(&local_10,o), bVar1) {
    QList<SafeSymbols>::const_iterator::operator*(&local_10);
    QSet<QByteArray>::operator<<((QSet<QByteArray> *)this_00.d,(QByteArray *)in_RDI);
    QSet<QByteArray>::operator+=((QSet<QByteArray> *)in_RDI,in_stack_ffffffffffffff98);
    QList<SafeSymbols>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QSet<QByteArray>)(Hash)this_00.d;
}

Assistant:

inline QSet<QByteArray> SymbolStack::excludeSymbols() const
{
    QSet<QByteArray> set;
    for (const SafeSymbols &sf : *this) {
        set << sf.expandedMacro;
        set += sf.excludedSymbols;
    }
    return set;
}